

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

Edge __thiscall geometrycentral::surface::SurfaceMesh::getNewEdge(SurfaceMesh *this)

{
  bool bVar1;
  logic_error *this_00;
  unsigned_long *puVar2;
  SurfaceMesh *in_RDI;
  function<void_(unsigned_long)> *f;
  iterator __end3;
  iterator __begin3;
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  *__range3;
  size_t newEdgeCapacity;
  SurfaceMesh *in_stack_ffffffffffffff88;
  function<void_(unsigned_long)> *in_stack_ffffffffffffff90;
  _Self in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_10;
  
  bVar1 = usesImplicitTwin(in_RDI);
  if (bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error
              (this_00,"cannot construct a single new edge with implicit twin convention");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  if (in_RDI->nEdgesCapacityCount <= in_RDI->nEdgesFillCount) {
    local_38 = in_RDI->nEdgesCapacityCount << 1;
    local_40 = 1;
    puVar2 = ::std::max<unsigned_long>(&local_38,&local_40);
    local_30 = *puVar2;
    in_RDI->nEdgesCapacityCount = local_30;
    bVar1 = usesImplicitTwin(in_RDI);
    if (!bVar1) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffffb0._M_node,(size_type)in_stack_ffffffffffffffa8._M_node);
    }
    ::std::__cxx11::
    list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
    ::begin((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
             *)in_stack_ffffffffffffff88);
    ::std::__cxx11::
    list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
    ::end((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
           *)in_stack_ffffffffffffff88);
    while (bVar1 = ::std::operator!=((_Self *)&stack0xffffffffffffffb0,
                                     (_Self *)&stack0xffffffffffffffa8), bVar1) {
      ::std::_List_iterator<std::function<void_(unsigned_long)>_>::operator*
                ((_List_iterator<std::function<void_(unsigned_long)>_> *)0x23177f);
      ::std::function<void_(unsigned_long)>::operator()
                (in_stack_ffffffffffffff90,(unsigned_long)in_stack_ffffffffffffff88);
      ::std::_List_iterator<std::function<void_(unsigned_long)>_>::operator++
                ((_List_iterator<std::function<void_(unsigned_long)>_> *)&stack0xffffffffffffffb0);
    }
  }
  in_RDI->nEdgesFillCount = in_RDI->nEdgesFillCount + 1;
  in_RDI->nEdgesCount = in_RDI->nEdgesCount + 1;
  in_RDI->modificationTick = in_RDI->modificationTick + 1;
  in_RDI->isCompressedFlag = false;
  Edge::Edge((Edge *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x2317f4);
  return (Edge)local_10;
}

Assistant:

Edge SurfaceMesh::getNewEdge() {

  if (usesImplicitTwin()) {
    throw std::logic_error("cannot construct a single new edge with implicit twin convention");
  }

  // The boring case, when no resize is needed
  if (nEdgesFillCount < nEdgesCapacityCount) {
    // No work needed
  }
  // The intesting case, where vectors resize
  else {
    size_t newEdgeCapacity = std::max(nEdgesCapacityCount * 2, (size_t)1);

    nEdgesCapacityCount = newEdgeCapacity;

    if (!usesImplicitTwin()) { // must enter this case, see test above
      eHalfedgeArr.resize(newEdgeCapacity);
    }

    // Invoke relevant callback functions
    for (auto& f : edgeExpandCallbackList) {
      f(newEdgeCapacity);
    }
  }

  nEdgesFillCount++;
  nEdgesCount++;

  modificationTick++;
  isCompressedFlag = false;
  return Edge(this, nEdgesFillCount - 1);
}